

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFCompileUnit.cpp
# Opt level: O1

void __thiscall
llvm::DWARFCompileUnit::dump(DWARFCompileUnit *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  raw_ostream *prVar1;
  DWARFAbbreviationDeclarationSet *pDVar2;
  StringRef SVar3;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  format_object_base local_78;
  uint64_t local_68;
  format_object_base local_60;
  uint16_t local_50;
  undefined1 local_48 [8];
  DWARFDie CUDie;
  
  CUDie.Die = (DWARFDebugInfoEntry *)(this->super_DWARFUnit).Header.Offset;
  CUDie.U = (DWARFUnit *)0xe74b1f;
  local_48 = (undefined1  [8])&PTR_home_01097f70;
  prVar1 = raw_ostream::operator<<(OS,(format_object_base *)local_48);
  SVar3.Length = 0xf;
  SVar3.Data = ": Compile Unit:";
  prVar1 = raw_ostream::operator<<(prVar1,SVar3);
  Str.Length = 10;
  Str.Data = " length = ";
  prVar1 = raw_ostream::operator<<(prVar1,Str);
  local_68 = (this->super_DWARFUnit).Header.Length;
  local_78.Fmt = "0x%08lx";
  local_78._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
  prVar1 = raw_ostream::operator<<(prVar1,&local_78);
  Str_00.Length = 0xb;
  Str_00.Data = " version = ";
  prVar1 = raw_ostream::operator<<(prVar1,Str_00);
  local_50 = (this->super_DWARFUnit).Header.FormParams.Version;
  local_60.Fmt = "0x%04x";
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01098078;
  raw_ostream::operator<<(prVar1,&local_60);
  if (4 < (this->super_DWARFUnit).Header.FormParams.Version) {
    Str_01.Length = 0xd;
    Str_01.Data = " unit_type = ";
    prVar1 = raw_ostream::operator<<(OS,Str_01);
    SVar3 = dwarf::UnitTypeString((uint)(this->super_DWARFUnit).Header.UnitType);
    raw_ostream::operator<<(prVar1,SVar3);
  }
  pDVar2 = DWARFUnit::getAbbreviations(&this->super_DWARFUnit);
  if (pDVar2 != (DWARFAbbreviationDeclarationSet *)0x0) {
    Str_02.Length = 0xf;
    Str_02.Data = " abbr_offset = ";
    prVar1 = raw_ostream::operator<<(OS,Str_02);
    CUDie.Die = (DWARFDebugInfoEntry *)pDVar2->Offset;
    CUDie.U = (DWARFUnit *)anon_var_dwarf_40da87f;
    local_48 = (undefined1  [8])&PTR_home_01097f70;
    raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  }
  Str_03.Length = 0xd;
  Str_03.Data = " addr_size = ";
  prVar1 = raw_ostream::operator<<(OS,Str_03);
  CUDie.U = (DWARFUnit *)0xe7dd6e;
  local_48 = (undefined1  [8])&PTR_home_01098098;
  CUDie.Die = (DWARFDebugInfoEntry *)
              CONCAT71(CUDie.Die._1_7_,(this->super_DWARFUnit).Header.FormParams.AddrSize);
  raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  if ((4 < (this->super_DWARFUnit).Header.FormParams.Version) &&
     ((this->super_DWARFUnit).Header.UnitType != '\x01')) {
    Str_04.Length = 10;
    Str_04.Data = " DWO_id = ";
    prVar1 = raw_ostream::operator<<(OS,Str_04);
    DWARFUnit::extractDIEsIfNeeded(&this->super_DWARFUnit,true);
    if (((this->super_DWARFUnit).Header.DWOId.Storage.hasVal & 1U) == 0) {
      __assert_fail("hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                    ,0xad,
                    "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                   );
    }
    CUDie.Die = *(DWARFDebugInfoEntry **)&(this->super_DWARFUnit).Header.DWOId.Storage.field_0;
    CUDie.U = (DWARFUnit *)anon_var_dwarf_40da8a7;
    local_48 = (undefined1  [8])&PTR_home_01097f70;
    raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  }
  Str_05.Length = 0xf;
  Str_05.Data = " (next unit at ";
  prVar1 = raw_ostream::operator<<(OS,Str_05);
  CUDie.Die = (DWARFDebugInfoEntry *)
              DWARFUnitHeader::getNextUnitOffset(&(this->super_DWARFUnit).Header);
  CUDie.U = (DWARFUnit *)0xe74b1f;
  local_48 = (undefined1  [8])&PTR_home_01097f70;
  prVar1 = raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  Str_06.Length = 2;
  Str_06.Data = ")\n";
  raw_ostream::operator<<(prVar1,Str_06);
  DWARFUnit::extractDIEsIfNeeded(&this->super_DWARFUnit,false);
  CUDie.U = (DWARFUnit *)
            (this->super_DWARFUnit).DieArray.
            super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (undefined1  [8])this;
  if (CUDie.U ==
      (DWARFUnit *)
      (this->super_DWARFUnit).DieArray.
      super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    CUDie.U = (DWARFUnit *)0x0;
    local_48 = (undefined1  [8])(DWARFUnit *)0x0;
  }
  if (CUDie.U == (DWARFUnit *)0x0) {
    Str_07.Length = 0x21;
    Str_07.Data = "<compile unit can\'t be parsed!>\n\n";
    raw_ostream::operator<<(OS,Str_07);
  }
  else {
    DWARFDie::dump((DWARFDie *)local_48,OS,0,DumpOpts);
  }
  return;
}

Assistant:

void DWARFCompileUnit::dump(raw_ostream &OS, DIDumpOptions DumpOpts) {
  OS << format("0x%08" PRIx64, getOffset()) << ": Compile Unit:"
     << " length = " << format("0x%08" PRIx64, getLength())
     << " version = " << format("0x%04x", getVersion());
  if (getVersion() >= 5)
    OS << " unit_type = " << dwarf::UnitTypeString(getUnitType());
  if (auto* Abbreviations = getAbbreviations()) { // XXX BINARYEN
    OS << " abbr_offset = "
       << format("0x%04" PRIx64, Abbreviations->getOffset());
  }
  OS << " addr_size = " << format("0x%02x", getAddressByteSize());
  if (getVersion() >= 5 && getUnitType() != dwarf::DW_UT_compile)
    OS << " DWO_id = " << format("0x%016" PRIx64, *getDWOId());
  OS << " (next unit at " << format("0x%08" PRIx64, getNextUnitOffset())
     << ")\n";

  if (DWARFDie CUDie = getUnitDIE(false))
    CUDie.dump(OS, 0, DumpOpts);
  else
    OS << "<compile unit can't be parsed!>\n\n";
}